

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_mp3_L3_imdct12(float *x,float *dst,float *overlap)

{
  float fVar1;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  float fVar2;
  float sum;
  float ovl;
  int i;
  float si [3];
  float co [3];
  int local_34;
  float local_30;
  uint local_2c;
  float local_24 [3];
  long local_18;
  long local_10;
  float *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ma_dr_mp3_L3_idct3(-*in_RDI,in_RDI[6] + in_RDI[3],in_RDI[0xc] + in_RDI[9],local_24);
  ma_dr_mp3_L3_idct3(local_8[0xf],local_8[0xc] - local_8[9],local_8[6] - local_8[3],&local_30);
  local_2c = local_2c ^ 0x80000000;
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    fVar1 = *(float *)(local_18 + (long)local_34 * 4);
    fVar2 = local_24[local_34] * ma_dr_mp3_L3_imdct12::g_twid3[local_34 + 3] +
            (&local_30)[local_34] * ma_dr_mp3_L3_imdct12::g_twid3[local_34];
    *(float *)(local_18 + (long)local_34 * 4) =
         local_24[local_34] * ma_dr_mp3_L3_imdct12::g_twid3[local_34] +
         -((&local_30)[local_34] * ma_dr_mp3_L3_imdct12::g_twid3[local_34 + 3]);
    *(float *)(local_10 + (long)local_34 * 4) =
         fVar1 * ma_dr_mp3_L3_imdct12::g_twid3[2 - local_34] +
         -(fVar2 * ma_dr_mp3_L3_imdct12::g_twid3[5 - local_34]);
    *(float *)(local_10 + (long)(5 - local_34) * 4) =
         fVar1 * ma_dr_mp3_L3_imdct12::g_twid3[5 - local_34] +
         fVar2 * ma_dr_mp3_L3_imdct12::g_twid3[2 - local_34];
  }
  return;
}

Assistant:

static void ma_dr_mp3_L3_imdct12(float *x, float *dst, float *overlap)
{
    static const float g_twid3[6] = { 0.79335334f,0.92387953f,0.99144486f, 0.60876143f,0.38268343f,0.13052619f };
    float co[3], si[3];
    int i;
    ma_dr_mp3_L3_idct3(-x[0], x[6] + x[3], x[12] + x[9], co);
    ma_dr_mp3_L3_idct3(x[15], x[12] - x[9], x[6] - x[3], si);
    si[1] = -si[1];
    for (i = 0; i < 3; i++)
    {
        float ovl  = overlap[i];
        float sum  = co[i]*g_twid3[3 + i] + si[i]*g_twid3[0 + i];
        overlap[i] = co[i]*g_twid3[0 + i] - si[i]*g_twid3[3 + i];
        dst[i]     = ovl*g_twid3[2 - i] - sum*g_twid3[5 - i];
        dst[5 - i] = ovl*g_twid3[5 - i] + sum*g_twid3[2 - i];
    }
}